

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  uchar *puVar1;
  uchar uVar2;
  unsigned_short grey;
  uchar uVar5;
  int iVar3;
  size_t sVar4;
  uchar uVar9;
  size_t sVar7;
  LodePNGColorMode *pLVar8;
  uint bits;
  uint uVar10;
  uchar uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_d8;
  unsigned_short local_d6;
  unsigned_short local_d4;
  unsigned_short local_d2;
  LodePNGColorMode *local_d0;
  ulong local_c8;
  LodePNGColorMode *local_c0;
  ColorTree local_b8;
  uchar uVar6;
  
  iVar3 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar3 != 0) {
    sVar4 = lodepng_get_raw_size(w,h,mode_in);
    if (sVar4 == 0) {
      return 0;
    }
    sVar7 = 0;
    do {
      out[sVar7] = in[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
    return 0;
  }
  local_c8 = (ulong)(h * w);
  local_d0 = mode_out;
  local_c0 = mode_in;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar12 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    uVar14 = mode_out->palettesize;
    pLVar8 = mode_out;
    if (uVar14 == 0) {
      uVar14 = mode_in->palettesize;
      pLVar8 = mode_in;
    }
    if (uVar14 < uVar12) {
      uVar12 = uVar14;
    }
    puVar1 = pLVar8->palette;
    local_b8.children[0xe] = (ColorTree *)0x0;
    local_b8.children[0xf] = (ColorTree *)0x0;
    local_b8.children[0xc] = (ColorTree *)0x0;
    local_b8.children[0xd] = (ColorTree *)0x0;
    local_b8.children[10] = (ColorTree *)0x0;
    local_b8.children[0xb] = (ColorTree *)0x0;
    local_b8.children[8] = (ColorTree *)0x0;
    local_b8.children[9] = (ColorTree *)0x0;
    local_b8.children[6] = (ColorTree *)0x0;
    local_b8.children[7] = (ColorTree *)0x0;
    local_b8.children[4] = (ColorTree *)0x0;
    local_b8.children[5] = (ColorTree *)0x0;
    local_b8.children[2] = (ColorTree *)0x0;
    local_b8.children[3] = (ColorTree *)0x0;
    local_b8.children[0] = (ColorTree *)0x0;
    local_b8.children[1] = (ColorTree *)0x0;
    local_b8.index = -1;
    if (uVar14 != 0) {
      uVar14 = 0;
      do {
        color_tree_add(&local_b8,puVar1[uVar14 * 4],puVar1[uVar14 * 4 + 1],puVar1[uVar14 * 4 + 2],
                       puVar1[uVar14 * 4 + 3],(uint)uVar14);
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
  }
  pLVar8 = local_d0;
  if (local_d0->bitdepth == 0x10 && local_c0->bitdepth == 0x10) {
    if (local_c8 != 0) {
      lVar13 = 0;
      sVar4 = 0;
      do {
        local_d2 = 0;
        local_d4 = 0;
        local_d6 = 0;
        local_d8 = 0;
        getPixelColorRGBA16(&local_d2,&local_d4,&local_d6,&local_d8,in,sVar4,local_c0);
        uVar2 = (uchar)local_d2;
        uVar5 = (uchar)(local_d2 >> 8);
        uVar9 = (uchar)(local_d8 >> 8);
        uVar11 = (uchar)(local_d4 >> 8);
        uVar6 = (uchar)(local_d6 >> 8);
        switch(local_d0->colortype) {
        case LCT_GREY:
          *(unsigned_short *)(out + sVar4 * 2) = local_d2 << 8 | local_d2 >> 8;
          break;
        case LCT_RGB:
          out[lVar13] = uVar5;
          out[lVar13 + 1] = uVar2;
          out[lVar13 + 2] = uVar11;
          out[lVar13 + 3] = (uchar)local_d4;
          out[lVar13 + 4] = uVar6;
          out[lVar13 + 5] = (uchar)local_d6;
          break;
        case LCT_GREY_ALPHA:
          out[sVar4 * 4] = uVar5;
          out[sVar4 * 4 + 1] = uVar2;
          out[sVar4 * 4 + 2] = uVar9;
          out[sVar4 * 4 + 3] = (uchar)local_d8;
          break;
        case LCT_RGBA:
          out[sVar4 * 8] = uVar5;
          out[sVar4 * 8 + 1] = uVar2;
          out[sVar4 * 8 + 2] = uVar11;
          out[sVar4 * 8 + 3] = (uchar)local_d4;
          out[sVar4 * 8 + 4] = uVar6;
          out[sVar4 * 8 + 5] = (uchar)local_d6;
          out[sVar4 * 8 + 6] = uVar9;
          out[sVar4 * 8 + 7] = (uchar)local_d8;
        }
        sVar4 = sVar4 + 1;
        lVar13 = lVar13 + 6;
      } while (local_c8 != sVar4);
    }
    goto LAB_0010aac5;
  }
  if (local_d0->bitdepth == 8) {
    if (local_d0->colortype == LCT_RGB) {
      uVar10 = 0;
    }
    else {
      if (local_d0->colortype != LCT_RGBA) goto LAB_0010a8e5;
      uVar10 = 1;
    }
    getPixelColorsRGBA8(out,local_c8,uVar10,in,local_c0);
  }
  else {
LAB_0010a8e5:
    local_d2 = local_d2 & 0xff00;
    local_d4 = local_d4 & 0xff00;
    local_d6 = local_d6 & 0xff00;
    local_d8 = local_d8 & 0xff00;
    if (local_c8 != 0) {
      lVar13 = 1;
      lVar15 = 0;
      sVar4 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_d2,(uchar *)&local_d4,(uchar *)&local_d6,
                           (uchar *)&local_d8,in,sVar4,local_c0);
        switch(pLVar8->colortype) {
        case LCT_GREY:
          bits = pLVar8->bitdepth;
          if (bits == 0x10) {
            out[lVar13] = (byte)local_d2;
            out[lVar13 + -1] = (byte)local_d2;
          }
          else {
            if (bits != 8) {
              uVar10 = ~(-1 << ((byte)bits & 0x1f)) &
                       (uint)((byte)local_d2 >> (8 - (byte)bits & 0x1f));
              goto LAB_0010aa93;
            }
            out[sVar4] = (byte)local_d2;
          }
          break;
        case LCT_RGB:
          if (pLVar8->bitdepth == 8) {
            out[lVar15] = (byte)local_d2;
            out[lVar15 + 1] = (uchar)local_d4;
            out[lVar15 + 2] = (uchar)local_d6;
          }
          else {
            out[lVar15 * 2 + 1] = (byte)local_d2;
            out[lVar15 * 2] = (byte)local_d2;
            out[lVar15 * 2 + 3] = (uchar)local_d4;
            out[lVar15 * 2 + 2] = (uchar)local_d4;
            out[lVar15 * 2 + 5] = (uchar)local_d6;
            out[lVar15 * 2 + 4] = (uchar)local_d6;
          }
          break;
        case LCT_PALETTE:
          uVar10 = color_tree_get(&local_b8,(byte)local_d2,(uchar)local_d4,(uchar)local_d6,
                                  (uchar)local_d8);
          if ((int)uVar10 < 0) {
            return 0x52;
          }
          bits = pLVar8->bitdepth;
          if (bits == 8) {
            out[sVar4] = (uchar)uVar10;
          }
          else {
LAB_0010aa93:
            addColorBits(out,sVar4,bits,uVar10);
          }
          break;
        case LCT_GREY_ALPHA:
          if (pLVar8->bitdepth == 0x10) {
            out[lVar13 * 2 + -1] = (byte)local_d2;
            out[lVar13 * 2 + -2] = (byte)local_d2;
            out[lVar13 * 2 + 1] = (uchar)local_d8;
            out[lVar13 * 2] = (uchar)local_d8;
          }
          else if (pLVar8->bitdepth == 8) {
            out[lVar13 + -1] = (byte)local_d2;
            out[lVar13] = (uchar)local_d8;
          }
          break;
        case LCT_RGBA:
          if (pLVar8->bitdepth == 8) {
            out[lVar13 * 2 + -2] = (byte)local_d2;
            out[lVar13 * 2 + -1] = (uchar)local_d4;
            out[lVar13 * 2] = (uchar)local_d6;
            out[lVar13 * 2 + 1] = (uchar)local_d8;
          }
          else {
            out[lVar13 * 4 + -3] = (byte)local_d2;
            out[lVar13 * 4 + -4] = (byte)local_d2;
            out[lVar13 * 4 + -1] = (uchar)local_d4;
            out[lVar13 * 4 + -2] = (uchar)local_d4;
            out[lVar13 * 4 + 1] = (uchar)local_d6;
            out[lVar13 * 4] = (uchar)local_d6;
            out[lVar13 * 4 + 3] = (uchar)local_d8;
            out[lVar13 * 4 + 2] = (uchar)local_d8;
          }
        }
        sVar4 = sVar4 + 1;
        lVar13 = lVar13 + 2;
        lVar15 = lVar15 + 3;
      } while (local_c8 != sVar4);
    }
  }
LAB_0010aac5:
  if (local_d0->colortype == LCT_PALETTE) {
    color_tree_cleanup(&local_b8);
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}